

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509name.cc
# Opt level: O0

int X509_NAME_ENTRY_set_data(X509_NAME_ENTRY *ne,int type,uchar *bytes,int len)

{
  int iVar1;
  ASN1_STRING *pAVar2;
  int in_register_0000000c;
  size_t local_30;
  ossl_ssize_t len_local;
  uchar *bytes_local;
  int type_local;
  X509_NAME_ENTRY *ne_local;
  
  local_30 = CONCAT44(in_register_0000000c,len);
  if ((ne == (X509_NAME_ENTRY *)0x0) || ((bytes == (uchar *)0x0 && (local_30 != 0)))) {
    ne_local._4_4_ = 0;
  }
  else if ((type < 1) || ((type & 0x1000U) == 0)) {
    if (in_register_0000000c < 0) {
      local_30 = strlen((char *)bytes);
    }
    iVar1 = ASN1_STRING_set((ASN1_STRING *)ne->value,bytes,local_30);
    if (iVar1 == 0) {
      ne_local._4_4_ = 0;
    }
    else {
      if (type != -1) {
        ne->value->type = type;
      }
      ne_local._4_4_ = 1;
    }
  }
  else {
    iVar1 = OBJ_obj2nid(ne->object);
    pAVar2 = ASN1_STRING_set_by_NID(&ne->value,bytes,len,type,iVar1);
    ne_local._4_4_ = (uint)(pAVar2 != (ASN1_STRING *)0x0);
  }
  return ne_local._4_4_;
}

Assistant:

int X509_NAME_ENTRY_set_data(X509_NAME_ENTRY *ne, int type,
                             const unsigned char *bytes, ossl_ssize_t len) {
  if ((ne == NULL) || ((bytes == NULL) && (len != 0))) {
    return 0;
  }
  if ((type > 0) && (type & MBSTRING_FLAG)) {
    return ASN1_STRING_set_by_NID(&ne->value, bytes, len, type,
                                  OBJ_obj2nid(ne->object))
               ? 1
               : 0;
  }
  if (len < 0) {
    len = strlen((const char *)bytes);
  }
  if (!ASN1_STRING_set(ne->value, bytes, len)) {
    return 0;
  }
  if (type != V_ASN1_UNDEF) {
    ne->value->type = type;
  }
  return 1;
}